

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-test-compare.cc
# Opt level: O2

void cleanEncryption(QPDF *q)

{
  char cVar1;
  QPDFObjectHandle enc;
  allocator<char> local_49;
  string local_48 [32];
  allocator<char> local_28 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  string local_18 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  QPDF::getTrailer();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"/Encrypt",&local_49);
  QPDFObjectHandle::getKey(local_18);
  std::__cxx11::string::~string(local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  cVar1 = QPDFObjectHandle::isDictionary();
  if (cVar1 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>(local_48,"/O",local_28);
    QPDFObjectHandle::removeKey(local_18);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::string<std::allocator<char>>(local_48,"/OE",local_28);
    QPDFObjectHandle::removeKey(local_18);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::string<std::allocator<char>>(local_48,"/U",local_28);
    QPDFObjectHandle::removeKey(local_18);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::string<std::allocator<char>>(local_48,"/UE",local_28);
    QPDFObjectHandle::removeKey(local_18);
    std::__cxx11::string::~string(local_48);
    std::__cxx11::string::string<std::allocator<char>>(local_48,"/Perms",local_28);
    QPDFObjectHandle::removeKey(local_18);
    std::__cxx11::string::~string(local_48);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  return;
}

Assistant:

void
cleanEncryption(QPDF& q)
{
    auto enc = q.getTrailer().getKey("/Encrypt");
    if (!enc.isDictionary()) {
        return;
    }
    enc.removeKey("/O");
    enc.removeKey("/OE");
    enc.removeKey("/U");
    enc.removeKey("/UE");
    enc.removeKey("/Perms");
}